

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int ASN1_TIME_print(BIO *fp,ASN1_TIME *a)

{
  ASN1_TIME *tm_local;
  BIO *bp_local;
  
  if (a->type == 0x17) {
    bp_local._4_4_ = ASN1_UTCTIME_print(fp,a);
  }
  else if (a->type == 0x18) {
    bp_local._4_4_ = ASN1_GENERALIZEDTIME_print(fp,a);
  }
  else {
    BIO_puts(fp,"Bad time value");
    bp_local._4_4_ = 0;
  }
  return bp_local._4_4_;
}

Assistant:

int ASN1_TIME_print(BIO *bp, const ASN1_TIME *tm) {
  if (tm->type == V_ASN1_UTCTIME) {
    return ASN1_UTCTIME_print(bp, tm);
  }
  if (tm->type == V_ASN1_GENERALIZEDTIME) {
    return ASN1_GENERALIZEDTIME_print(bp, tm);
  }
  BIO_puts(bp, "Bad time value");
  return 0;
}